

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O2

void __thiscall
BpTree<int>::Redistribute(BpTree<int> *this,IndexNode<int> *C,IndexNode<int> *D,int k2,int i,int j)

{
  uint uVar1;
  pointer piVar2;
  pointer pcVar3;
  pointer pAVar4;
  int *piVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  IndexNode<int> P;
  IndexNode<int> E;
  IndexNode<int> local_390;
  IndexNode<int> local_330;
  IndexNode<int> local_2d0;
  IndexNode<int> local_270;
  IndexNode<int> local_210;
  IndexNode<int> local_1b0;
  IndexNode<int> local_150;
  IndexNode<int> local_f0;
  IndexNode<int> local_90;
  
  IndexNode<int>::IndexNode(&local_150,C);
  Buffer::Lock(&blocks,local_150.self.BlockNum);
  IndexNode<int>::~IndexNode(&local_150);
  IndexNode<int>::IndexNode(&local_1b0,D);
  Buffer::Lock(&blocks,local_1b0.self.BlockNum);
  IndexNode<int>::~IndexNode(&local_1b0);
  IndexNode<int>::IndexNode(&P,this->N);
  IndexNode<int>::IndexNode(&E,this->N);
  FindNode(this,C->parent,&P);
  if (j < i) {
    IndexNode<int>::IndexNode(&local_90,C);
    IndexNode<int>::~IndexNode(&local_90);
    uVar1 = this->N;
    if (local_90.NodeState == '1') {
      uVar7 = 1;
      if (1 < (int)uVar1) {
        uVar7 = uVar1;
      }
      uVar7 = uVar7 - 1;
      for (uVar11 = 0; uVar7 != uVar11; uVar11 = uVar11 + 1) {
        if ((D->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar11] != '1') {
          uVar7 = (uint)uVar11;
          break;
        }
      }
      for (uVar11 = (ulong)(uVar1 - 2); 0 < (int)uVar11; uVar11 = uVar11 - 1) {
        piVar2 = (C->k).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar2[uVar11] = piVar2[uVar11 - 1];
        pcVar3 = (C->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pcVar3[uVar11] = pcVar3[uVar11 - 1];
        pAVar4 = (C->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pAVar4[uVar11] = pAVar4[uVar11 - 1];
      }
      lVar6 = (long)(int)uVar7;
      *(C->k).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
           = (D->k).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start[lVar6 + -1];
      *(C->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
       _M_start = '1';
      *(C->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
       _M_start = (D->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar6 + -1];
      P.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[j]
           = (D->k).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start[lVar6 + -1];
      (D->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar6 + -1] = '0';
      pAVar4 = (D->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
               super__Vector_impl_data._M_start + lVar6 + -1;
      pAVar4->BlockNum = -1;
      pAVar4->FileOff = -1;
    }
    else {
      uVar10 = 0;
      uVar11 = 0;
      if (0 < (int)uVar1) {
        uVar11 = (ulong)uVar1;
      }
      for (; uVar11 != uVar10; uVar10 = uVar10 + 1) {
        if ((D->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar10].FileOff == -1) {
          uVar11 = uVar10 & 0xffffffff;
          break;
        }
      }
      pAVar4 = (C->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
               super__Vector_impl_data._M_start;
      pAVar4[(long)(int)uVar1 + -1] = pAVar4[(long)(int)uVar1 + -2];
      for (uVar10 = (ulong)(this->N - 2);
          piVar5 = (C->k).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start, 0 < (int)uVar10; uVar10 = uVar10 - 1) {
        piVar5[uVar10] = piVar5[uVar10 - 1];
        pcVar3 = (C->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pcVar3[uVar10] = pcVar3[uVar10 - 1];
        pAVar4 = (C->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pAVar4[uVar10] = pAVar4[uVar10 - 1];
      }
      lVar6 = (long)(int)uVar11;
      *piVar5 = k2;
      *(C->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
       _M_start = '1';
      *(C->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
       _M_start = (D->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar6 + -1];
      FindNode(this,(D->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar6 + -1],&E);
      E.parent = C->self;
      IndexNode<int>::IndexNode(&local_210,&E);
      UpdateBlock(this,&local_210);
      IndexNode<int>::~IndexNode(&local_210);
      P.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[j]
           = (D->k).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start[lVar6 + -2];
      pAVar4 = (D->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
               super__Vector_impl_data._M_start + lVar6 + -1;
      pAVar4->BlockNum = -1;
      pAVar4->FileOff = -1;
      (D->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar6 + -2] = '0';
    }
  }
  else {
    IndexNode<int>::IndexNode(&local_f0,C);
    IndexNode<int>::~IndexNode(&local_f0);
    uVar1 = this->N;
    if (local_f0.NodeState == '1') {
      pcVar3 = (C->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar7 = 1;
      if (1 < (int)uVar1) {
        uVar7 = uVar1;
      }
      for (uVar11 = 0;
          (uVar10 = (ulong)(uVar7 - 1), uVar7 - 1 != uVar11 &&
          (uVar10 = uVar11, pcVar3[uVar11] == '1')); uVar11 = uVar11 + 1) {
      }
      (C->k).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [uVar10] = *(D->k).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
      pcVar3[uVar10] = '1';
      (C->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar10] =
           *(D->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
            _M_start;
      P.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[i]
           = (D->k).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start[1];
      for (lVar6 = 1; lVar6 < (long)this->N + -1; lVar6 = lVar6 + 1) {
        piVar2 = (D->k).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar2[lVar6 + -1] = piVar2[lVar6];
        pcVar3 = (D->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pcVar3[lVar6 + -1] = pcVar3[lVar6];
        pAVar4 = (D->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pAVar4[lVar6 + -1] = pAVar4[lVar6];
      }
      pAVar4 = (D->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
               super__Vector_impl_data._M_start + (long)this->N + -2;
      pAVar4->BlockNum = -1;
      pAVar4->FileOff = -1;
    }
    else {
      uVar10 = 0;
      uVar11 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar11 = uVar10;
      }
      for (; uVar8 = uVar11, uVar11 != uVar10; uVar10 = uVar10 + 1) {
        if ((C->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar10].FileOff == -1) {
          uVar11 = uVar10 & 0xffffffff;
          uVar8 = uVar10;
          break;
        }
      }
      (C->k).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [(long)(int)uVar11 + -1] = k2;
      (C->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start[(long)(int)uVar11 + -1] = '1';
      (C->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar8] =
           *(D->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
            _M_start;
      FindNode(this,*(D->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                     super__Vector_impl_data._M_start,&E);
      E.parent = C->self;
      IndexNode<int>::IndexNode(&local_270,&E);
      UpdateBlock(this,&local_270);
      IndexNode<int>::~IndexNode(&local_270);
      P.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[i]
           = *(D->k).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start;
      for (lVar6 = 1; lVar9 = (long)this->N, lVar6 < lVar9 + -1; lVar6 = lVar6 + 1) {
        piVar2 = (D->k).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar2[lVar6 + -1] = piVar2[lVar6];
        pcVar3 = (D->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pcVar3[lVar6 + -1] = pcVar3[lVar6];
        pAVar4 = (D->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pAVar4[lVar6 + -1] = pAVar4[lVar6];
      }
      pAVar4 = (D->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
               super__Vector_impl_data._M_start;
      pAVar4[lVar9 + -2] = pAVar4[lVar9 + -1];
      pAVar4 = (D->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
               super__Vector_impl_data._M_start + (long)this->N + -1;
      pAVar4->BlockNum = -1;
      pAVar4->FileOff = -1;
    }
    (D->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
    [(long)this->N + -2] = '0';
  }
  IndexNode<int>::IndexNode(&local_2d0,C);
  UpdateBlock(this,&local_2d0);
  IndexNode<int>::~IndexNode(&local_2d0);
  IndexNode<int>::IndexNode(&local_330,D);
  UpdateBlock(this,&local_330);
  IndexNode<int>::~IndexNode(&local_330);
  IndexNode<int>::IndexNode(&local_390,&P);
  UpdateBlock(this,&local_390);
  IndexNode<int>::~IndexNode(&local_390);
  IndexNode<int>::~IndexNode(&E);
  IndexNode<int>::~IndexNode(&P);
  return;
}

Assistant:

void BpTree<K>::Redistribute(IndexNode<K>& C, IndexNode<K>& D, K k2, int i, int j) {
	this->LockNode(C);
	this->LockNode(D);
	IndexNode<K> P(N);
	IndexNode<K> E(N);
	this->FindNode(C.parent, P);
	int m, n;
	//�������������
	if (j < i) {
		//D��C������
		if (!this->IsLeaf(C)) {
			for (m = 0; m < N && D.p[m].FileOff != -1; m++);
			m--;		//D.p[m]��D�����һ����Чָ��
			C.p[N - 1] = C.p[N - 2];
			for (n = N - 2; n >= 1; n--) {
				C.k[n] = C.k[n - 1];
				C.v[n] = C.v[n - 1];
				C.p[n] = C.p[n - 1];
			}
			C.k[0] = k2;
			C.v[0] = '1';
			C.p[0] = D.p[m];							//�ֳ�����һ�����C��
			this->FindNode(D.p[m], E);
			E.parent = C.self;		//���±��ƶ����ĸ���
			this->UpdateBlock(E);
			P.k[j] = D.k[m - 1];						//����CD֮��ļ�ֵ
			D.p[m] = { -1,-1 };
			D.v[m - 1] = '0';							//ɾ��D�б��ֳ�ȥ����һ��
		}
		else {
			for (m = 0; m < N - 1 && D.v[m] == '1'; m++);
			m--;		//(D.p[m],D.k[m])��D�����һ����Ч����
			for (n = N - 2; n >= 1; n--) {
				C.k[n] = C.k[n - 1];
				C.v[n] = C.v[n - 1];
				C.p[n] = C.p[n - 1];
			}
			C.k[0] = D.k[m];
			C.v[0] = '1';
			C.p[0] = D.p[m];							//�ֳ�����һ�����C��
			P.k[j] = D.k[m];		//����CD֮��ļ�ֵ
			D.v[m] = '0';
			D.p[m] = { -1, -1 };						//ɾ��D�б��ֳ�ȥ����һ��
		}
	}
	else {
		//D��C������
		if (!this->IsLeaf(C)) {
			for (m = 0; m < N && C.p[m].FileOff != -1; m++);		//C.p[m]��C.k[m-1]�ǿյ�
			C.k[m - 1] = k2;
			C.v[m - 1] = '1';
			C.p[m] = D.p[0];
			this->FindNode(D.p[0], E);
			E.parent = C.self;
			this->UpdateBlock(E);
			P.k[i] = D.k[0];
			for (n = 1; n < N - 1; n++) {
				D.k[n - 1] = D.k[n];
				D.v[n - 1] = D.v[n];
				D.p[n - 1] = D.p[n];
			}
			D.p[N - 2] = D.p[N - 1];
			D.p[N - 1] = { -1, -1 };
			D.v[N - 2] = '0';
		}
		else {
			for (m = 0; m < N - 1 && C.v[m] == '1'; m++);		//C.k[m]��C.p[m]�ǿյ�
			C.k[m] = D.k[0];
			C.v[m] = '1';
			C.p[m] = D.p[0];
			P.k[i] = D.k[1];
			for (n = 1; n < N - 1; n++) {
				D.k[n - 1] = D.k[n];
				D.v[n - 1] = D.v[n];
				D.p[n - 1] = D.p[n];
			}
			D.p[N - 2] = { -1, -1 };
			D.v[N - 2] = '0';
		}
	}
	this->UpdateBlock(C);
	this->UpdateBlock(D);
	this->UpdateBlock(P);
	return;
}